

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outrec)

{
  OutPt **ppOVar1;
  OutPt *pOVar2;
  bool bVar3;
  byte local_99;
  OutPt *tmp;
  OutPt *pOStack_28;
  bool preserveCol;
  OutPt *pp;
  OutPt *lastOK;
  OutRec *outrec_local;
  Clipper *this_local;
  
  pp = (OutPt *)0x0;
  outrec->BottomPt = (OutPt *)0x0;
  local_99 = 1;
  if (((byte)(this->_vptr_Clipper[-3] + 0x10)
             [(long)&(this->m_IntersectList).
                     super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
             ] & 1) == 0) {
    local_99 = this->m_StrictSimple;
  }
  pOStack_28 = outrec->Pts;
  lastOK = (OutPt *)outrec;
  outrec_local = (OutRec *)this;
  while ((pOStack_28->Prev != pOStack_28 && (pOStack_28->Prev != pOStack_28->Next))) {
    bVar3 = ClipperLib::operator==(&pOStack_28->Pt,&pOStack_28->Next->Pt);
    if (((bVar3) || (bVar3 = ClipperLib::operator==(&pOStack_28->Pt,&pOStack_28->Prev->Pt), bVar3))
       || ((bVar3 = SlopesEqual(pOStack_28->Prev->Pt,pOStack_28->Pt,pOStack_28->Next->Pt,
                                (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                             [(long)&(this->m_GhostJoins).
                                                                                                          
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                             ] & 1)), bVar3 &&
           (((local_99 & 1) == 0 ||
            (bVar3 = Pt2IsBetweenPt1AndPt3(pOStack_28->Prev->Pt,pOStack_28->Pt,pOStack_28->Next->Pt)
            , !bVar3)))))) {
      pOVar2 = pOStack_28;
      pp = (OutPt *)0x0;
      pOStack_28->Prev->Next = pOStack_28->Next;
      pOStack_28->Next->Prev = pOStack_28->Prev;
      ppOVar1 = &pOStack_28->Prev;
      bVar3 = pOStack_28 != (OutPt *)0x0;
      pOStack_28 = *ppOVar1;
      if (bVar3) {
        operator_delete(pOVar2,0x28);
      }
    }
    else {
      if (pOStack_28 == pp) {
        lastOK->Next = pOStack_28;
        return;
      }
      if (pp == (OutPt *)0x0) {
        pp = pOStack_28;
      }
      pOStack_28 = pOStack_28->Next;
    }
  }
  DisposeOutPts(&stack0xffffffffffffffd8);
  lastOK->Next = (OutPt *)0x0;
  return;
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outrec)
{
    //FixupOutPolygon() - removes duplicate points and simplifies consecutive
    //parallel edges by removing the middle vertex.
    OutPt *lastOK = 0;
    outrec.BottomPt = 0;
    OutPt *pp = outrec.Pts;
    bool preserveCol = m_PreserveCollinear || m_StrictSimple;

    for (;;)
    {
        if (pp->Prev == pp || pp->Prev == pp->Next)
        {
            DisposeOutPts(pp);
            outrec.Pts = 0;
            return;
        }

        //test for duplicate points and collinear edges ...
        if ((pp->Pt == pp->Next->Pt) || (pp->Pt == pp->Prev->Pt) ||
            (SlopesEqual(pp->Prev->Pt, pp->Pt, pp->Next->Pt, m_UseFullRange) &&
            (!preserveCol || !Pt2IsBetweenPt1AndPt3(pp->Prev->Pt, pp->Pt, pp->Next->Pt))))
        {
            lastOK = 0;
            OutPt *tmp = pp;
            pp->Prev->Next = pp->Next;
            pp->Next->Prev = pp->Prev;
            pp = pp->Prev;
            delete tmp;
        }
        else if (pp == lastOK) break;
        else
        {
            if (!lastOK) lastOK = pp;
            pp = pp->Next;
        }
    }
    outrec.Pts = pp;
}